

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

string * include_file(string *__return_storage_ptr__,string *filename)

{
  string *psVar1;
  int iVar2;
  char *pcVar3;
  pointer pcVar4;
  pointer __lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sp;
  string sfilename;
  stat finfo;
  char rp [4096];
  allocator local_1109;
  string *local_1108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e8;
  stat local_10c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038 [128];
  
  pcVar3 = (filename->_M_dataplus)._M_p;
  local_1108 = __return_storage_ptr__;
  if (*pcVar3 == '/') {
    pcVar3 = realpath(pcVar3,(char *)local_1038);
    if (pcVar3 == (char *)0x0) {
      pcVar4 = (filename->_M_dataplus)._M_p;
      pcVar3 = "Cannot open include file %s\n";
      goto LAB_0012fcb0;
    }
    iVar2 = stat((char *)local_1038,&local_10c8);
    psVar1 = local_1108;
    if (iVar2 == 0) {
      std::__cxx11::string::string((string *)local_1108,(char *)local_1038,(allocator *)&local_10e8)
      ;
      return psVar1;
    }
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1100,&g_incl_searchpath_abi_cxx11_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&local_1100,
             (const_iterator)
             local_1100.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&g_curdir_abi_cxx11_);
    for (__lhs = local_1100.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != local_1100.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      std::operator+(local_1038,__lhs,"/");
      std::operator+(&local_10e8,local_1038,filename);
      std::__cxx11::string::~string((string *)local_1038);
      pcVar3 = realpath(local_10e8._M_dataplus._M_p,(char *)local_1038);
      if ((pcVar3 != (char *)0x0) &&
         (iVar2 = stat((char *)local_1038,&local_10c8), psVar1 = local_1108, iVar2 == 0)) {
        std::__cxx11::string::string((string *)local_1108,(char *)local_1038,&local_1109);
        std::__cxx11::string::~string((string *)&local_10e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1100);
        return psVar1;
      }
      std::__cxx11::string::~string((string *)&local_10e8);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1100);
  }
  pcVar4 = (filename->_M_dataplus)._M_p;
  pcVar3 = "Could not find include file %s\n";
LAB_0012fcb0:
  pwarning(0,pcVar3,pcVar4);
  (local_1108->_M_dataplus)._M_p = (pointer)&local_1108->field_2;
  local_1108->_M_string_length = 0;
  (local_1108->field_2)._M_local_buf[0] = '\0';
  return local_1108;
}

Assistant:

string include_file(string filename) {
    // Absolute path? Just try that
    if (filename[0] == '/') {
        // Realpath!
        char rp[THRIFT_PATH_MAX];
        // cppcheck-suppress uninitvar
        if (saferealpath(filename.c_str(), rp) == nullptr) {
            pwarning(0, "Cannot open include file %s\n", filename.c_str());
            return std::string();
        }

        // Stat this file
        struct stat finfo;
        if (stat(rp, &finfo) == 0) {
            return rp;
        }
    } else { // relative path, start searching
        // new search path with current dir global
        vector<string> sp = g_incl_searchpath;
        sp.insert(sp.begin(), g_curdir);

        // iterate through paths
        vector<string>::iterator it;
        for (it = sp.begin(); it != sp.end(); it++) {
            string sfilename = *(it) + "/" + filename;

            // Realpath!
            char rp[THRIFT_PATH_MAX];
            // cppcheck-suppress uninitvar
            if (saferealpath(sfilename.c_str(), rp) == nullptr) {
                continue;
            }

            // Stat this files
            struct stat finfo;
            if (stat(rp, &finfo) == 0) {
                return rp;
            }
        }
    }

    // Uh oh
    pwarning(0, "Could not find include file %s\n", filename.c_str());
    return std::string();
}